

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O3

int lj_cf_jit_util_traceinfo(lua_State *L)

{
  uint64_t uVar1;
  long lVar2;
  TValue *pTVar3;
  char *__s;
  uint uVar4;
  int iVar5;
  size_t lenx;
  GCstr *pGVar6;
  GCtab *t;
  
  uVar4 = lj_lib_checkint(L,1);
  iVar5 = 0;
  if (((uVar4 != 0) && (uVar1 = (L->glref).ptr64, uVar4 < *(uint *)(uVar1 + 0x46c))) &&
     (lVar2 = *(long *)(*(long *)(uVar1 + 0x460) + (ulong)uVar4 * 8), lVar2 != 0)) {
    lua_createtable(L,0,8);
    t = (GCtab *)(L->top[-1].u64 & 0x7fffffffffff);
    setintfield(L,t,"nins",*(int *)(lVar2 + 0xc) + -0x8001);
    setintfield(L,t,"nk",0x8000 - *(int *)(lVar2 + 0x28));
    setintfield(L,t,"link",(uint)*(ushort *)(lVar2 + 0x6a));
    setintfield(L,t,"nexit",(uint)*(ushort *)(lVar2 + 10));
    pTVar3 = L->top;
    L->top = pTVar3 + 1;
    __s = jit_trlinkname[*(byte *)(lVar2 + 0x74)];
    lenx = strlen(__s);
    pGVar6 = lj_str_new(L,__s,lenx);
    pTVar3->u64 = (ulong)pGVar6 | 0xfffd800000000000;
    lua_setfield(L,-2,"linktype");
    iVar5 = 1;
  }
  return iVar5;
}

Assistant:

LJLIB_CF(jit_util_traceinfo)
{
  GCtrace *T = jit_checktrace(L);
  if (T) {
    GCtab *t;
    lua_createtable(L, 0, 8);  /* Increment hash size if fields are added. */
    t = tabV(L->top-1);
    setintfield(L, t, "nins", (int32_t)T->nins - REF_BIAS - 1);
    setintfield(L, t, "nk", REF_BIAS - (int32_t)T->nk);
    setintfield(L, t, "link", T->link);
    setintfield(L, t, "nexit", T->nsnap);
    setstrV(L, L->top++, lj_str_newz(L, jit_trlinkname[T->linktype]));
    lua_setfield(L, -2, "linktype");
    /* There are many more fields. Add them only when needed. */
    return 1;
  }
  return 0;
}